

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::SampleDepthCase::init(SampleDepthCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  GLenum GVar2;
  deBool dVar3;
  int extraout_EAX;
  RenderTarget *this_00;
  NotSupportedError *this_01;
  MessageBuilder *pMVar4;
  MessageBuilder local_328;
  MessageBuilder local_1a8;
  TestLog *local_18;
  TestLog *log;
  SampleDepthCase *this_local;
  
  log = (TestLog *)this;
  local_18 = tcu::TestContext::getLog
                       ((this->super_NumSamplesCase).super_MultisampleCase.super_TestCase.
                        super_TestCase.super_TestNode.m_testCtx);
  this_00 = gles3::Context::getRenderTarget
                      ((this->super_NumSamplesCase).super_MultisampleCase.super_TestCase.m_context);
  iVar1 = tcu::RenderTarget::getDepthBits(this_00);
  if (iVar1 != 0) {
    MultisampleCase::init((MultisampleCase *)this,ctx);
    do {
      glwEnable(0xb71);
      GVar2 = glwGetError();
      glu::checkError(GVar2,"glEnable(GL_DEPTH_TEST)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                      ,0x42f);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      glwDepthFunc(0x201);
      GVar2 = glwGetError();
      glu::checkError(GVar2,"glDepthFunc(GL_LESS)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                      ,0x430);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    tcu::TestLog::operator<<(&local_1a8,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1a8,(char (*) [42])"Depth test enabled, depth func is GL_LESS");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    tcu::TestLog::operator<<(&local_328,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_328,
                        (char (*) [85])
                        "Drawing several bigger-than-viewport black or white polygons intersecting each other"
                       );
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_328);
    return extraout_EAX;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Test requires depth buffer",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
             ,0x42b);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void SampleDepthCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	if (m_context.getRenderTarget().getDepthBits() == 0)
		TCU_THROW(NotSupportedError, "Test requires depth buffer");

	MultisampleCase::init();

	GLU_CHECK_CALL(glEnable(GL_DEPTH_TEST));
	GLU_CHECK_CALL(glDepthFunc(GL_LESS));

	log << TestLog::Message << "Depth test enabled, depth func is GL_LESS" << TestLog::EndMessage;
	log << TestLog::Message << "Drawing several bigger-than-viewport black or white polygons intersecting each other" << TestLog::EndMessage;
}